

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_actor::state_write(se_actor *this)

{
  xr_packet *in_RSI;
  
  state_write((se_actor *)
              &this[-1].super_cse_alife_creature_actor.super_cse_alife_creature_abstract.field_0xe0,
              in_RSI);
  return;
}

Assistant:

void se_actor::state_write(xr_packet& packet)
{
	cse_alife_creature_actor::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);
		
		set_save_marker(packet, SM_SAVE, false, "se_actor");
		packet.w_bool(0);		//start_position_filled
		set_save_marker(packet, SM_SAVE, true, "se_actor");

	} else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_SAVE, false, "se_actor");

		// CRandomTask
		set_save_marker(packet, SM_SAVE, false, "CRandomTask");
		packet.w_u16(0);
		// CRandomTask's id_generator
		set_save_marker(packet, SM_SAVE, false, "object_collection");
		w_object_collection(packet);
		set_save_marker(packet, SM_SAVE, true, "object_collection");
		packet.w_u8(0);
		packet.w_u16(0);
		set_save_marker(packet, SM_SAVE, true, "CRandomTask");

		// sim_board's id_generator
		set_save_marker(packet, SM_SAVE, false, "object_collection");
		w_object_collection(packet);
		set_save_marker(packet, SM_SAVE, true, "object_collection");

		// CMinigames
		set_save_marker(packet, SM_SAVE, false, "CMinigames");
		packet.w_u16(2);
		packet.w_sz("test_crowkiller");
		packet.w_sz("CMGCrowKiller");
		packet.w_sz("valiable");
		set_save_marker(packet, SM_SAVE, false, "CMGCrowKiller");
		packet.w_u8(0);
		packet.w_u16(60);
		packet.w_bool(false);
		packet.w_u8(4);
		packet.w_u32(0);
		packet.w_u16(10);
		packet.w_u16(100);
		packet.w_u8(0);
		packet.w_sz("");
		packet.w_u8(0);
		packet.w_u16(0);
		packet.w_u16(10);
		packet.w_u8(0);
		packet.w_bool(false);
		set_save_marker(packet, SM_SAVE, true, "CMGCrowKiller");

		packet.w_sz("test_shooting");
		packet.w_sz("CMGShooting");
		packet.w_sz("valiable");
		set_save_marker(packet, SM_SAVE, false, "CMGShooting");
		packet.w_sz("");
		packet.w_sz("");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_sz("nil");
		packet.w_u8(1);
		packet.w_u16(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u8(0);
		packet.w_u32(0);
		packet.w_sz("nil");
		set_save_marker(packet, SM_SAVE, true, "CMGShooting");
		set_save_marker(packet, SM_SAVE, true, "CMinigames");

		set_save_marker(packet, SM_SAVE, true, "se_actor");
	} else if (m_version >= CSE_VERSION_2215 && m_version <= CSE_VERSION_SOC) {
		// stub
	} else {
		xr_not_implemented();
	}
}